

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void pop_sorted_suite::pop_alternating(void)

{
  int *piVar1;
  array<int,_4UL> *paVar2;
  array<int,_4UL> *paVar3;
  array<int,_4UL> *paVar4;
  array<int,_4UL> expect;
  array<int,_4UL> storage;
  int local_38 [2];
  
  paVar2 = &expect;
  paVar3 = &expect;
  paVar4 = &expect;
  storage._M_elems[0] = 0xb;
  storage._M_elems[1] = 0x16;
  storage._M_elems[2] = 0x21;
  storage._M_elems[3] = 0x2c;
  expect._M_elems[0] = 0xb;
  piVar1 = vista::lower_bound_sorted<int*,int,std::less<int>>(&storage,local_38,&expect);
  vista::pop_sorted<false,int*>(piVar1,local_38);
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x565,"void pop_sorted_suite::pop_alternating()",storage._M_elems,local_38,
             expect._M_elems,storage._M_elems);
  expect._M_elems[0] = 0x2c;
  piVar1 = vista::lower_bound_sorted<int*,int,std::less<int>>
                     (&storage,storage._M_elems + 3,&expect,paVar2);
  vista::pop_sorted<false,int*>(piVar1,storage._M_elems + 3);
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x56d,"void pop_sorted_suite::pop_alternating()",storage._M_elems,local_38,
             expect._M_elems,storage._M_elems);
  expect._M_elems[0] = 0x16;
  piVar1 = vista::lower_bound_sorted<int*,int,std::less<int>>
                     (&storage,storage._M_elems + 2,&expect,paVar3);
  vista::pop_sorted<false,int*>(piVar1,storage._M_elems + 2);
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x575,"void pop_sorted_suite::pop_alternating()",storage._M_elems,local_38,
             expect._M_elems,storage._M_elems);
  expect._M_elems[0] = 0x21;
  piVar1 = vista::lower_bound_sorted<int*,int,std::less<int>>
                     (&storage,storage._M_elems + 1,&expect,paVar4);
  vista::pop_sorted<false,int*>(piVar1,storage._M_elems + 1);
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x57d,"void pop_sorted_suite::pop_alternating()",storage._M_elems,local_38,
             expect._M_elems,storage._M_elems);
  return;
}

Assistant:

void pop_alternating()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    auto last = storage.end();
    auto first = lower_bound_sorted(storage.begin(), last, 11);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 44);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 22);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 33, 22, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 33);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 33, 22, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}